

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_dist_to_edge(REF_NODE ref_node,REF_INT *nodes,REF_DBL *xyz,REF_DBL *distance)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double local_c8;
  double local_b8;
  REF_DBL t;
  REF_DBL dis;
  REF_DBL len;
  REF_DBL normal [3];
  REF_DBL diff [3];
  REF_DBL direction [3];
  REF_DBL *b;
  REF_DBL *a;
  REF_DBL *distance_local;
  REF_DBL *xyz_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  pdVar1 = ref_node->real + *nodes * 0xf;
  pdVar2 = ref_node->real + nodes[1] * 0xf;
  dVar3 = *pdVar2 - *pdVar1;
  dVar4 = pdVar2[1] - pdVar1[1];
  dVar5 = pdVar2[2] - pdVar1[2];
  dVar6 = dVar5 * (xyz[2] - pdVar1[2]) + dVar3 * (*xyz - *pdVar1) + dVar4 * (xyz[1] - pdVar1[1]);
  dVar3 = dVar5 * dVar5 + dVar3 * dVar3 + dVar4 * dVar4;
  if (dVar3 * 1e+20 <= 0.0) {
    local_b8 = -(dVar3 * 1e+20);
  }
  else {
    local_b8 = dVar3 * 1e+20;
  }
  local_c8 = dVar6;
  if (dVar6 <= 0.0) {
    local_c8 = -dVar6;
  }
  if (local_b8 <= local_c8) {
    *distance = 0.0;
    printf("%s: %d: %s: div zero dis %.18e len %.18e\n",dVar6,dVar3,
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xc32,
           "ref_node_dist_to_edge");
    ref_node_local._4_4_ = 4;
  }
  else {
    dVar6 = dVar6 / dVar3;
    dVar3 = *xyz - (dVar6 * *pdVar2 + (1.0 - dVar6) * *pdVar1);
    dVar4 = xyz[1] - (dVar6 * pdVar2[1] + (1.0 - dVar6) * pdVar1[1]);
    dVar5 = xyz[2] - (dVar6 * pdVar2[2] + (1.0 - dVar6) * pdVar1[2]);
    dVar3 = sqrt(dVar5 * dVar5 + dVar3 * dVar3 + dVar4 * dVar4);
    *distance = dVar3;
    ref_node_local._4_4_ = 0;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_dist_to_edge(REF_NODE ref_node, REF_INT *nodes,
                                         REF_DBL *xyz, REF_DBL *distance) {
  REF_DBL *a, *b;
  REF_DBL direction[3], diff[3], normal[3];
  REF_DBL len, dis, t;

  a = ref_node_xyz_ptr(ref_node, nodes[0]);
  b = ref_node_xyz_ptr(ref_node, nodes[1]);
  direction[0] = b[0] - a[0];
  direction[1] = b[1] - a[1];
  direction[2] = b[2] - a[2];
  diff[0] = xyz[0] - a[0];
  diff[1] = xyz[1] - a[1];
  diff[2] = xyz[2] - a[2];

  dis = ref_math_dot(direction, diff);
  len = ref_math_dot(direction, direction);

  if (ref_math_divisible(dis, len)) {
    t = dis / len;
  } else {
    *distance = 0.0;
    printf("%s: %d: %s: div zero dis %.18e len %.18e\n", __FILE__, __LINE__,
           __func__, dis, len);
    return REF_DIV_ZERO;
  }

  normal[0] = xyz[0] - (t * b[0] + (1.0 - t) * a[0]);
  normal[1] = xyz[1] - (t * b[1] + (1.0 - t) * a[1]);
  normal[2] = xyz[2] - (t * b[2] + (1.0 - t) * a[2]);

  *distance = sqrt(ref_math_dot(normal, normal));

  return REF_SUCCESS;
}